

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_booke206_tlbwe_ppc64(CPUPPCState_conflict2 *env)

{
  ulong uVar1;
  int tlbn_00;
  uint32_t uVar2;
  ulong uVar3;
  ppcmas_tlb_t *tlb_00;
  CPUState *cpu;
  hwaddr hVar4;
  uintptr_t unaff_retaddr;
  ulong local_30;
  target_ulong mask;
  uint32_t size_ps;
  uint32_t size_tlb;
  ppcmas_tlb_t *tlb;
  uint32_t tlbn;
  uint32_t tlbncfg;
  CPUPPCState_conflict2 *env_local;
  
  uVar3 = env->spr[0x270] & 0x3000;
  if ((uVar3 == 0) || (uVar3 == 0x1000)) {
    if (((env->spr[0x270] & 0xffffffff80000000) == 0xffffffff80000000) &&
       ((env->msr >> 0x1c & 1) == 0)) {
      fprintf(_stderr,"cpu: don\'t support LRAT setting yet\n");
    }
    else {
      tlbn_00 = (int)((env->spr[0x270] & 0x30000000) >> 0x1c);
      uVar3 = env->spr[tlbn_00 + 0x2b0];
      tlb_00 = booke206_cur_tlb(env);
      if (tlb_00 == (ppcmas_tlb_t *)0x0) {
        raise_exception_err_ra_ppc64(env,6,0x21,unaff_retaddr);
      }
      uVar1 = env->spr[0x271];
      uVar2 = booke206_tlbnps(env,tlbn_00);
      if ((((env->spr[0x271] & 0x80000000) != 0) && ((uVar3 & 0x4000) != 0)) &&
         ((uVar2 & 1 << (sbyte)((uVar1 & 0xf80) >> 7)) == 0)) {
        raise_exception_err_ra_ppc64(env,6,0x21,unaff_retaddr);
      }
      if ((env->msr >> 0x1c & 1) != 0) {
        cpu = env_cpu(env);
        cpu_abort_ppc64(cpu,"missing HV implementation\n");
      }
      if ((tlb_00->mas1 & 0x80000000) != 0) {
        flush_page(env,tlb_00);
      }
      tlb_00->mas7_3 = env->spr[0x3b0] << 0x20 | env->spr[0x273];
      tlb_00->mas1 = (uint32_t)env->spr[0x271];
      if ((env->spr[0x3f7] & 3) == 1) {
        booke206_fixed_size_tlbn(env,tlbn_00,tlb_00);
      }
      else if ((uVar3 & 0x4000) == 0) {
        tlb_00->mas1 = tlb_00->mas1 & 0xfffff07f;
        tlb_00->mas1 = ((uint)uVar3 & 0xf00000) >> 0xc | tlb_00->mas1;
      }
      hVar4 = booke206_tlb_to_page_size(env,tlb_00);
      local_30 = hVar4 - 1 ^ 0xffffffffffffffff;
      if ((env->msr >> 0x1f & 1) == 0) {
        local_30 = local_30 & 0xffffffff;
      }
      local_30 = local_30 | 0x7f;
      tlb_00->mas2 = env->spr[0x272] & local_30;
      if ((uVar3 & 0x8000) == 0) {
        tlb_00->mas1 = tlb_00->mas1 & 0xbfffffff;
      }
      flush_page(env,tlb_00);
    }
  }
  return;
}

Assistant:

void helper_booke206_tlbwe(CPUPPCState *env)
{
    uint32_t tlbncfg, tlbn;
    ppcmas_tlb_t *tlb;
    uint32_t size_tlb, size_ps;
    target_ulong mask;


    switch (env->spr[SPR_BOOKE_MAS0] & MAS0_WQ_MASK) {
    case MAS0_WQ_ALWAYS:
        /* good to go, write that entry */
        break;
    case MAS0_WQ_COND:
        /* XXX check if reserved */
        if (0) {
            return;
        }
        break;
    case MAS0_WQ_CLR_RSRV:
        /* XXX clear entry */
        return;
    default:
        /* no idea what to do */
        return;
    }

    if (((env->spr[SPR_BOOKE_MAS0] & MAS0_ATSEL) == MAS0_ATSEL_LRAT) &&
        !msr_gs) {
        /* XXX we don't support direct LRAT setting yet */
        fprintf(stderr, "cpu: don't support LRAT setting yet\n");
        return;
    }

    tlbn = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlbn];

    tlb = booke206_cur_tlb(env);

    if (!tlb) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    }

    /* check that we support the targeted size */
    size_tlb = (env->spr[SPR_BOOKE_MAS1] & MAS1_TSIZE_MASK) >> MAS1_TSIZE_SHIFT;
    size_ps = booke206_tlbnps(env, tlbn);
    if ((env->spr[SPR_BOOKE_MAS1] & MAS1_VALID) && (tlbncfg & TLBnCFG_AVAIL) &&
        !(size_ps & (1 << size_tlb))) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    }

    if (msr_gs) {
        cpu_abort(env_cpu(env), "missing HV implementation\n");
    }

    if (tlb->mas1 & MAS1_VALID) {
        /*
         * Invalidate the page in QEMU TLB if it was a valid entry.
         *
         * In "PowerPC e500 Core Family Reference Manual, Rev. 1",
         * Section "12.4.2 TLB Write Entry (tlbwe) Instruction":
         * (https://www.nxp.com/docs/en/reference-manual/E500CORERM.pdf)
         *
         * "Note that when an L2 TLB entry is written, it may be displacing an
         * already valid entry in the same L2 TLB location (a victim). If a
         * valid L1 TLB entry corresponds to the L2 MMU victim entry, that L1
         * TLB entry is automatically invalidated."
         */
        flush_page(env, tlb);
    }

    tlb->mas7_3 = ((uint64_t)env->spr[SPR_BOOKE_MAS7] << 32) |
        env->spr[SPR_BOOKE_MAS3];
    tlb->mas1 = env->spr[SPR_BOOKE_MAS1];

    if ((env->spr[SPR_MMUCFG] & MMUCFG_MAVN) == MMUCFG_MAVN_V2) {
        /* For TLB which has a fixed size TSIZE is ignored with MAV2 */
        booke206_fixed_size_tlbn(env, tlbn, tlb);
    } else {
        if (!(tlbncfg & TLBnCFG_AVAIL)) {
            /* force !AVAIL TLB entries to correct page size */
            tlb->mas1 &= ~MAS1_TSIZE_MASK;
            /* XXX can be configured in MMUCSR0 */
            tlb->mas1 |= (tlbncfg & TLBnCFG_MINSIZE) >> 12;
        }
    }

    /* Make a mask from TLB size to discard invalid bits in EPN field */
    mask = ~(booke206_tlb_to_page_size(env, tlb) - 1);
    /* Add a mask for page attributes */
    mask |= MAS2_ACM | MAS2_VLE | MAS2_W | MAS2_I | MAS2_M | MAS2_G | MAS2_E;

    if (!msr_cm) {
        /*
         * Executing a tlbwe instruction in 32-bit mode will set bits
         * 0:31 of the TLB EPN field to zero.
         */
        mask &= 0xffffffff;
    }

    tlb->mas2 = env->spr[SPR_BOOKE_MAS2] & mask;

    if (!(tlbncfg & TLBnCFG_IPROT)) {
        /* no IPROT supported by TLB */
        tlb->mas1 &= ~MAS1_IPROT;
    }

    flush_page(env, tlb);
}